

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

BlockDataPtr
vkt::ssbo::anon_unknown_15::getBlockDataPtr
          (BufferLayout *layout,BlockLayoutEntry *blockLayout,void *ptr,int bufferSize)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  BlockDataPtr BVar6;
  
  piVar1 = (blockLayout->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar2 = 0;
  piVar3 = (blockLayout->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (piVar5 = piVar3; piVar5 != piVar1; piVar5 = piVar5 + 1) {
    if ((*(int *)((long)layout + (long)*piVar5 * 0x48 + 0x2c) == 0) ||
       (*(int *)((long)layout + (long)*piVar5 * 0x48 + 0x38) == 0)) {
      goto LAB_006c2aab;
    }
  }
  goto LAB_006c2ae8;
  while (piVar3 = piVar3 + 1, piVar3 != piVar1) {
LAB_006c2aab:
    iVar4 = *piVar3;
    if (*(int *)((long)layout + (long)iVar4 * 0x48 + 0x2c) == 0) {
      iVar4 = *(int *)((long)layout + (long)iVar4 * 0x48 + 0x30);
      goto LAB_006c2ad7;
    }
    if (*(int *)((long)layout + (long)iVar4 * 0x48 + 0x38) == 0) {
      iVar4 = *(int *)((long)layout + (long)iVar4 * 0x48 + 0x3c);
      goto LAB_006c2ad7;
    }
  }
  iVar4 = 0;
LAB_006c2ad7:
  uVar2 = (long)(bufferSize - blockLayout->size) / (long)(int)(iVar4 + (uint)(iVar4 == 0)) << 0x20;
LAB_006c2ae8:
  BVar6._8_8_ = (uint)bufferSize | uVar2;
  BVar6.ptr = ptr;
  return BVar6;
}

Assistant:

BlockDataPtr getBlockDataPtr (const BufferLayout& layout, const BlockLayoutEntry& blockLayout, void* ptr, int bufferSize)
{
	const bool	isLastUnsized	= hasUnsizedArray(layout, blockLayout);
	const int	baseSize		= blockLayout.size;

	if (isLastUnsized)
	{
		const int		lastArrayStride	= getUnsizedArrayStride(layout, blockLayout);
		const int		lastArraySize	= (bufferSize-baseSize) / (lastArrayStride ? lastArrayStride : 1);

		DE_ASSERT(baseSize + lastArraySize*lastArrayStride == bufferSize);

		return BlockDataPtr(ptr, bufferSize, lastArraySize);
	}
	else
		return BlockDataPtr(ptr, bufferSize, 0);
}